

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any __thiscall cs_impl::any::make_constant<int,int&>(any *this,int *args)

{
  proxy *ppVar1;
  int local_28 [2];
  holder<int> *local_20;
  
  local_28[1] = 2;
  local_28[0] = 1;
  local_20 = cs::allocator_type<cs_impl::any::holder<int>,64ul,cs_impl::default_allocator_provider>
             ::alloc<int&>((allocator_type<cs_impl::any::holder<int>,64ul,cs_impl::default_allocator_provider>
                            *)holder<int>::allocator,args);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,int,cs_impl::any::holder<int>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,local_28 + 1,local_28,&local_20);
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}